

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch.h
# Opt level: O2

void __thiscall
testinator::BranchScope::BranchScope(BranchScope *this,int line,char *file,char *name)

{
  bool bVar1;
  Branch *pBVar2;
  Branch *pBVar3;
  deque<testinator::Branch*,std::allocator<testinator::Branch*>> *this_00;
  Branch *local_28;
  
  pBVar2 = Branch::currentParent();
  this->m_parent = pBVar2;
  pBVar3 = Branch::pushChild(pBVar2,line,file,name);
  this->m_child = pBVar3;
  pBVar2 = this->m_parent;
  bVar1 = pBVar2->m_canRunChild;
  this->m_canRun = bVar1;
  if (bVar1 == false) {
    pBVar2->m_complete = false;
  }
  else {
    bVar1 = pBVar3->m_complete;
    this->m_canRun = (bool)(bVar1 ^ 1);
    if (bVar1 == false) {
      pBVar2->m_canRunChild = false;
      this_00 = (deque<testinator::Branch*,std::allocator<testinator::Branch*>> *)Branch::getStack()
      ;
      local_28 = this->m_child;
      ::std::deque<testinator::Branch*,std::allocator<testinator::Branch*>>::
      emplace_back<testinator::Branch*>(this_00,&local_28);
      this->m_child->m_complete = true;
    }
  }
  return;
}

Assistant:

BranchScope(int line, const char* file, const char* name)
      : m_parent(Branch::currentParent())
      , m_child(m_parent.pushChild(line, file, name))
    {
      m_canRun = m_parent.canRunChild();
      if (!m_canRun)
      {
        m_parent.setComplete(false);
        return;
      }
      m_canRun = !m_child.isComplete();
      if (m_canRun)
      {
        m_parent.setCanRunChild(false);
        Branch::getStack().push(&m_child);
        m_child.setComplete(true);
      }
    }